

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeConstraint::updateChannelRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  
  ShapeRange::intersect((ShapeRange *)&err,&this->_channelRange,other);
  *(size_type *)&(this->_channelRange)._maximum = err.field_2._M_allocated_capacity;
  (this->_channelRange)._maximum._val = err.field_2._8_8_;
  *(pointer *)&(this->_channelRange)._minimum = err._M_dataplus._M_p;
  (this->_channelRange)._minimum._val = err._M_string_length;
  return;
}

Assistant:

void ShapeConstraint::updateChannelRange(const ShapeRange& other) {
    try {
        _channelRange = _channelRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid channel range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}